

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt_solver_basis.cc
# Opt level: O1

void __thiscall ipx::KKTSolverBasis::_Factorize(KKTSolverBasis *this,Iterate *iterate,Info *info)

{
  Int *pIVar1;
  ipxint *piVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  Int IVar7;
  double *colscale;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  Maxvolume maxvol;
  Maxvolume local_68;
  
  iVar3 = this->model_->num_cols_;
  pIVar1 = &this->model_->num_rows_;
  iVar4 = *pIVar1;
  uVar6 = iVar3 + *pIVar1;
  (info->super_ipx_info).errflag = 0;
  this->factorized_ = false;
  this->iter_ = 0;
  this->basis_changes_ = 0;
  if (uVar6 != 0 && SCARRY4(iVar3,iVar4) == (int)uVar6 < 0) {
    uVar8 = 0;
    do {
      dVar9 = Iterate::ScalingFactor(iterate,(Int)uVar8);
      (this->colscale_)._M_data[uVar8] = dVar9;
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  dVar9 = Iterate::pobjective(iterate);
  dVar10 = Iterate::dobjective(iterate);
  if ((dVar9 < dVar10) ||
     ((DropPrimal(this,iterate,info), (info->super_ipx_info).errflag == 0 &&
      (DropDual(this,iterate,info), (info->super_ipx_info).errflag == 0)))) {
    Maxvolume::Maxvolume(&local_68,this->control_);
    colscale = (this->colscale_)._M_data;
    if ((this->control_->parameters_).super_ipx_parameters.update_heuristic == 0) {
      IVar7 = Maxvolume::RunSequential(&local_68,colscale,this->basis_);
    }
    else {
      IVar7 = Maxvolume::RunHeuristic(&local_68,colscale,this->basis_);
    }
    (info->super_ipx_info).errflag = IVar7;
    IVar7 = Maxvolume::updates(&local_68);
    piVar2 = &(info->super_ipx_info).updates_ipm;
    *piVar2 = *piVar2 + IVar7;
    Maxvolume::time(&local_68,(time_t *)colscale);
    (info->super_ipx_info).time_maxvol = extraout_XMM0_Qa + (info->super_ipx_info).time_maxvol;
    IVar7 = Maxvolume::updates(&local_68);
    this->basis_changes_ = this->basis_changes_ + IVar7;
    if ((info->super_ipx_info).errflag == 0) {
      bVar5 = Basis::FactorizationIsFresh(this->basis_);
      if (!bVar5) {
        IVar7 = Basis::Factorize(this->basis_);
        (info->super_ipx_info).errflag = IVar7;
        if (IVar7 != 0) {
          return;
        }
      }
      SplittedNormalMatrix::Prepare
                (&this->splitted_normal_matrix_,this->basis_,(this->colscale_)._M_data);
      this->factorized_ = true;
    }
  }
  return;
}

Assistant:

void KKTSolverBasis::_Factorize(Iterate* iterate, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    info->errflag = 0;
    factorized_ = false;
    iter_ = 0;
    basis_changes_ = 0;

    for (Int j = 0; j < n+m; j++)
        colscale_[j] = iterate->ScalingFactor(j);

    // Remove degenerate variables unless the primal objective is smaller than
    // the dual objective. In the latter case the model might be infeasible or
    // unbounded. In order not to affect an infeasibility test in the IPM (not
    // yet implemented) we do not remove variables if the model looks
    // infeasible.
    if (iterate->pobjective() >= iterate->dobjective()) {
        DropPrimal(iterate, info);
        if (info->errflag)
            return;
        DropDual(iterate, info);
        if (info->errflag)
            return;
    }

    // Run maxvolume ("Russian algorithm").
    Maxvolume maxvol(control_);
    if (control_.update_heuristic() == 0) {
        info->errflag = maxvol.RunSequential(&colscale_[0], basis_);
    } else {
        info->errflag = maxvol.RunHeuristic(&colscale_[0], basis_);
    }
    info->updates_ipm += maxvol.updates();
    info->time_maxvol += maxvol.time();
    basis_changes_ += maxvol.updates();
    if (info->errflag)
        return;

    // Refactorize and build preconditioned normal matrix.
    if (!basis_.FactorizationIsFresh()) {
        info->errflag = basis_.Factorize();
        if (info->errflag)
            return;
    }
    splitted_normal_matrix_.Prepare(basis_, &colscale_[0]);

    factorized_ = true;
}